

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void __thiscall
Fossilize::StateRecorder::init_recording_thread(StateRecorder *this,DatabaseInterface *iface)

{
  undefined4 uVar1;
  Impl *pIVar2;
  long lVar3;
  long lVar4;
  long *in_FS_OFFSET;
  bool bVar5;
  thread local_58;
  anon_struct_40_5_2613688a_for_record_data local_50;
  
  pIVar2 = this->impl;
  pIVar2->database_iface = iface;
  local_50.write_database_entries = true;
  local_50._0_8_ = local_50._0_8_ & 0xffffffff;
  local_50.need_flush = false;
  local_50.need_prepare = true;
  local_50.blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Impl::anon_struct_40_5_2613688a_for_record_data::operator=(&pIVar2->record_data,&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_50.blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  pIVar2 = this->impl;
  if (pIVar2->module_identifier_database_iface == (DatabaseInterface *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = pIVar2->on_use_database_iface != (DatabaseInterface *)0x0;
  }
  pIVar2->should_record_identifier_only = bVar5;
  lVar3 = *in_FS_OFFSET;
  uVar1 = *(undefined4 *)(lVar3 + -0x18);
  lVar4 = *(long *)(lVar3 + -0x10);
  lVar3 = *(long *)(lVar3 + -8);
  local_58._M_id._M_thread = (id)0;
  local_50._0_8_ = operator_new(0x28);
  *(undefined ***)local_50._0_8_ = &PTR___State_003ad7e8;
  *(undefined4 *)(local_50._0_8_ + 8) = uVar1;
  *(long *)(local_50._0_8_ + 0x10) = lVar4;
  *(long *)(local_50._0_8_ + 0x18) = lVar3;
  *(StateRecorder **)(local_50._0_8_ + 0x20) = this;
  std::thread::_M_start_thread(&local_58,&local_50,0);
  if ((long *)local_50._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_50._0_8_ + 8))();
  }
  std::thread::operator=(&this->impl->worker_thread,&local_58);
  std::thread::~thread(&local_58);
  return;
}

Assistant:

void StateRecorder::init_recording_thread(DatabaseInterface *iface)
{
	impl->database_iface = iface;
	impl->record_data = {};
	impl->should_record_identifier_only =
			impl->module_identifier_database_iface && impl->on_use_database_iface;

	auto level = get_thread_log_level();
	auto cb = Internal::get_thread_log_callback();
	auto userdata = Internal::get_thread_log_userdata();
	impl->worker_thread = std::thread([=]() {
		set_thread_log_level(level);
		set_thread_log_callback(cb, userdata);
		impl->record_task(this, true);
	});
}